

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

string * TestSuite::getInfoMsg_abi_cxx11_(void)

{
  long *in_FS_OFFSET;
  
  if (*(char *)(*in_FS_OFFSET + -0x1370) == '\0') {
    getInfoMsg_abi_cxx11_();
  }
  return (string *)(*in_FS_OFFSET + -0x1390);
}

Assistant:

static std::string& getInfoMsg() {
        thread_local std::string info_msg;
        return info_msg;
    }